

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiPopupRef *pIVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  undefined4 w0;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ImGuiID id;
  byte bVar12;
  uint uVar13;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImVec2 ta;
  ImVec2 local_b0;
  uint local_a4;
  char *local_a0;
  ImVec2 local_94;
  float local_8c;
  undefined1 local_88 [16];
  ImGuiWindow **local_78;
  ImGuiWindow *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  local_a0 = label;
  IVar5 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88._8_4_ = extraout_XMM0_Dc;
  local_88._0_4_ = IVar5.x;
  local_88._4_4_ = IVar5.y;
  local_88._12_4_ = extraout_XMM0_Dd;
  bVar8 = IsPopupOpen(id);
  uVar13 = this->Flags;
  if (((uVar13 >> 0x1a & 1) == 0) &&
     (iVar2 = (pIVar6->BeginPopupStack).Size, iVar2 < (pIVar6->OpenPopupStack).Size)) {
    local_70 = pIVar6->NavWindow;
    if ((pIVar6->OpenPopupStack).Data[iVar2].OpenParentId !=
        (this->IDStack).Data[(long)(this->IDStack).Size + -1]) goto LAB_0014fce5;
    pIVar6->NavWindow = this;
    bVar12 = 1;
  }
  else {
    local_70 = pIVar6->NavWindow;
LAB_0014fce5:
    bVar12 = 0;
  }
  local_78 = &pIVar6->NavWindow;
  fVar16 = (this->DC).CursorPos.x;
  fVar14 = (this->DC).CursorPos.y;
  local_a4 = (uint)bVar8;
  if ((this->DC).LayoutType == 0) {
    fVar15 = (float)(int)((pIVar6->Style).ItemSpacing.x * 0.5);
    local_94.x = (fVar16 + -1.0) - fVar15;
    local_94.y = 0.0;
    if ((uVar13 >> 10 & 1) != 0) {
      fVar18 = (GImGui->Style).FramePadding.y;
      local_94.y = fVar18 + fVar18 +
                   GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
    }
    local_94.y = (fVar14 - (pIVar6->Style).FramePadding.y) + local_94.y;
    (this->DC).CursorPos.x = fVar16 + fVar15;
    IVar5 = (pIVar6->Style).ItemSpacing;
    fVar14 = IVar5.x;
    fVar16 = IVar5.y;
    local_b0.y = fVar16 + fVar16;
    local_b0.x = fVar14 + fVar14;
    PushStyleVar(0xd,&local_b0);
    local_b0.y = 0.0;
    local_b0.x = (float)local_88._0_4_;
    bVar9 = Selectable(local_a0,SUB41(local_a4,0),(uint)!enabled * 8 + 0xc01,&local_b0);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar6->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
    if (enabled) goto LAB_0014ff2e;
    bVar10 = false;
  }
  else {
    local_94.y = fVar14 - (pIVar6->Style).WindowPadding.y;
    w0 = local_88._0_4_;
    local_88 = ZEXT416((uint)fVar14);
    local_94.x = fVar16;
    local_58 = ZEXT416((uint)fVar16);
    local_8c = ImGuiMenuColumns::DeclColumns
                         (&this->MenuColumns,(float)w0,0.0,(float)(int)(pIVar6->FontSize * 1.2));
    IVar5 = GetContentRegionAvail();
    fVar14 = IVar5.x - local_8c;
    local_68 = ZEXT416(~-(uint)(fVar14 <= 0.0) & (uint)fVar14);
    local_b0.y = 0.0;
    local_b0.x = local_8c;
    bVar9 = Selectable(local_a0,bVar8,(uint)!enabled * 8 + 0x2c01,&local_b0);
    if (enabled) {
      IVar1.y = (float)local_88._0_4_ + 0.0;
      IVar1.x = (float)local_58._0_4_ +
                pIVar6->FontSize * 0.3 + (float)local_68._0_4_ + (this->MenuColumns).Pos[2];
      RenderArrow(IVar1,1,1.0);
LAB_0014ff2e:
      bVar10 = ItemHoverable(&(this->DC).LastItemRect,id);
    }
    else {
      bVar10 = false;
      PushStyleColor(0,(pIVar6->Style).Colors + 1);
      IVar5.y = (float)local_88._0_4_ + 0.0;
      IVar5.x = (float)local_58._0_4_ +
                pIVar6->FontSize * 0.3 + (float)local_68._0_4_ + (this->MenuColumns).Pos[2];
      RenderArrow(IVar5,1,1.0);
      PopStyleColor(1);
    }
  }
  if (bVar12 != 0) {
    *local_78 = local_70;
  }
  if ((this->DC).LayoutType == 1) {
    if ((((pIVar6->HoveredWindow == this) &&
         (iVar2 = (pIVar6->BeginPopupStack).Size, iVar2 < (pIVar6->OpenPopupStack).Size)) &&
        (pIVar3 = (pIVar6->OpenPopupStack).Data, pIVar3[iVar2].ParentWindow == this)) &&
       (((this->Flags & 0x400) == 0 && (pIVar4 = pIVar3[iVar2].Window, pIVar4 != (ImGuiWindow *)0x0)
        ))) {
      local_38.x = (pIVar4->Pos).x;
      fVar14 = (pIVar4->Pos).y;
      IVar5 = (pIVar6->IO).MousePos;
      IVar1 = (pIVar6->IO).MouseDelta;
      fVar16 = IVar5.x - IVar1.x;
      local_b0.y = IVar5.y - IVar1.y;
      if (local_38.x < (this->Pos).x || local_38.x == (this->Pos).x) {
        local_38.x = local_38.x + (pIVar4->Size).x;
        fVar15 = 0.5;
      }
      else {
        fVar15 = -0.5;
      }
      fVar17 = ABS(fVar16 - local_38.x) * 0.3;
      fVar18 = 30.0;
      if (fVar17 <= 30.0) {
        fVar18 = fVar17;
      }
      fVar18 = (float)(-(uint)(fVar17 < 5.0) & 0x40a00000 | ~-(uint)(fVar17 < 5.0) & (uint)fVar18);
      local_b0.x = fVar15 + fVar16;
      fVar16 = (fVar14 - fVar18) - local_b0.y;
      if (fVar16 <= -100.0) {
        fVar16 = -100.0;
      }
      local_38.y = fVar16 + local_b0.y;
      fVar14 = ((pIVar4->Size).y + fVar14 + fVar18) - local_b0.y;
      if (100.0 <= fVar14) {
        fVar14 = 100.0;
      }
      local_40.y = fVar14 + local_b0.y;
      local_40.x = local_38.x;
      bVar11 = ImTriangleContainsPoint(&local_b0,&local_38,&local_40,&(pIVar6->IO).MousePos);
    }
    else {
      bVar11 = false;
    }
    if ((bVar10 != false || !bVar8) || (pIVar6->HoveredWindow != this)) {
      bVar12 = 0;
    }
    else {
      bVar12 = (bVar11 ^ 1U) & pIVar6->HoveredIdPreviousFrame != 0 &
               pIVar6->HoveredIdPreviousFrame != id;
    }
    bVar11 = (bool)((bVar10 ^ 1U | bVar11 | bVar8) ^ 1);
    if (!bVar8) {
      bVar11 = (bool)(bVar9 & bVar10 | bVar11);
    }
    bVar10 = pIVar6->NavActivateId != id;
    bVar9 = !bVar8;
    if (bVar10) {
      bVar9 = bVar11;
    }
    uVar13 = (uint)bVar12;
    if (!bVar10) {
      uVar13 = local_a4;
    }
    bVar12 = (byte)uVar13;
    if (((pIVar6->NavId != id) || (pIVar6->NavMoveRequest != true)) ||
       (bVar7 = bVar12, pIVar6->NavMoveDir != 1)) goto LAB_0015016e;
  }
  else {
    if (bVar9 != false) {
      bVar12 = bVar12 & bVar9 & bVar8;
      bVar8 = (bool)(bVar8 ^ bVar12);
      bVar9 = (bool)(bVar12 ^ 1);
      goto LAB_0015016e;
    }
    if ((byte)(bVar8 | bVar12 & bVar10 ^ 1) != 1) {
      bVar9 = true;
      bVar8 = false;
      bVar12 = 0;
      goto LAB_0015016e;
    }
    if ((pIVar6->NavId != id) || (pIVar6->NavMoveRequest != true)) {
      bVar9 = false;
      bVar12 = 0;
      goto LAB_0015016e;
    }
    bVar12 = 0;
    bVar7 = 0;
    if (pIVar6->NavMoveDir != 3) {
      bVar9 = false;
      goto LAB_0015016e;
    }
  }
  bVar12 = bVar7;
  NavMoveRequestCancel();
  bVar9 = true;
LAB_0015016e:
  if (((!enabled) || (bVar12 != 0)) && (bVar10 = IsPopupOpen(id), bVar10)) {
    ClosePopupToLevel((pIVar6->BeginPopupStack).Size,true);
  }
  if (((~bVar9 & 1U) == 0 && bVar8 == false) &&
     ((pIVar6->BeginPopupStack).Size < (pIVar6->OpenPopupStack).Size)) {
    OpenPopup(local_a0);
    return false;
  }
  if (bVar9 == false) {
    if (bVar8 == false) {
      return false;
    }
  }
  else {
    OpenPopup(local_a0);
  }
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  SetNextWindowPos(&local_94,1,&local_b0);
  bVar8 = BeginPopupEx(id,(uint)((this->Flags & 0x14000000U) != 0) << 0x18 | 0x10080145);
  return bVar8;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu (using FindBestWindowPosForPopup).
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - (float)(int)(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderArrow(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), ImGuiDir_Right);
        if (!enabled) PopStyleColor();
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false, want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].ParentWindow == window && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.BeginPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
        if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
            flags |= ImGuiWindowFlags_ChildWindow;
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}